

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall higan::Buffer::CopyExDataToBuffer(Buffer *this,char *exbuffer,size_t ex_len)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  size_t __n;
  ulong uVar4;
  
  sVar1 = this->read_idx_;
  if (sVar1 - 8 < ex_len) {
    std::vector<char,_std::allocator<char>_>::resize
              (&this->buffer_,
               (size_type)
               ((this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (ex_len - (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
  }
  else {
    __n = this->write_idx_ - sVar1;
    if (__n != 0) {
      pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar2 + 8,pcVar2 + sVar1,__n);
    }
    this->write_idx_ = this->write_idx_ - (sVar1 - 8);
    this->read_idx_ = 8;
  }
  if (ex_len != 0) {
    memmove((this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + this->write_idx_,exbuffer,ex_len);
  }
  uVar4 = ex_len + this->write_idx_;
  uVar3 = (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  this->write_idx_ = uVar3;
  return;
}

Assistant:

void Buffer::CopyExDataToBuffer(const char* exbuffer, size_t ex_len)
{

	size_t drop_len = read_idx_ - DEFAULT_READ_INDEX;
	/**
	 * 可以将已读的内容丢弃来 从远buffer_中得到足够的空间
	 * 无法得到则扩容
	 */
	if (drop_len >= ex_len)
	{
		std::copy(ReadBegin(), ReadBegin() + ReadableSize(), &buffer_[DEFAULT_READ_INDEX]);

		write_idx_ -= drop_len;
		read_idx_ = DEFAULT_READ_INDEX;
	}
	else
	{
		buffer_.resize(buffer_.size() + ex_len);
	}

	std::copy(exbuffer, exbuffer + ex_len, WriteBegin());
	AddWriteIndex(ex_len);
}